

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

string * __thiscall
Assimp::XFileParser::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,XFileParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  string s;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  paVar1 = &s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  s._M_dataplus._M_p = (pointer)paVar1;
  if (this->mIsBinaryFormat != true) {
    FindNextNoneWhiteSpace(this);
    if (this->mP < this->mEnd) {
      while (pbVar3 = (byte *)this->mP, pbVar3 < this->mEnd) {
        bVar2 = *pbVar3;
        iVar6 = isspace((uint)bVar2);
        if (iVar6 != 0) break;
        if ((((bVar2 == 0x2c) || (bVar2 == 0x3b)) || (bVar2 == 0x7d)) || (bVar2 == 0x7b)) {
          if (s._M_string_length == 0) {
            this->mP = (char *)(pbVar3 + 1);
            std::__cxx11::string::append((char *)&s,(ulong)pbVar3);
          }
          break;
        }
        this->mP = (char *)(pbVar3 + 1);
        std::__cxx11::string::append((char *)&s,(ulong)pbVar3);
      }
      goto switchD_00526519_caseD_4;
    }
LAB_00526602:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._8_8_;
    __return_storage_ptr__->_M_string_length = 0;
    goto LAB_0052666c;
  }
  if ((long)this->mEnd - (long)this->mP < 2) goto LAB_00526602;
  uVar5 = ReadBinWord(this);
  switch(uVar5) {
  case 1:
    if ((long)this->mEnd - (long)this->mP < 4) goto switchD_00526519_caseD_4;
    uVar7 = ReadBinDWord(this);
    if ((-1 < (int)uVar7) && (pcVar4 = this->mP, (int)uVar7 <= *(int *)&this->mEnd - (int)pcVar4)) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar4,pcVar4 + uVar7);
      std::__cxx11::string::operator=((string *)&s,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      this->mP = this->mP + uVar7;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      goto LAB_00526649;
    }
    goto LAB_0052663c;
  case 2:
    if ((long)this->mEnd - (long)this->mP < 4) goto switchD_00526519_caseD_4;
    uVar7 = ReadBinDWord(this);
    pcVar4 = this->mP;
    if ((long)this->mEnd - (long)pcVar4 < (long)(int)uVar7) goto LAB_0052663c;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar4,pcVar4 + uVar7);
    std::__cxx11::string::operator=((string *)&s,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    this->mP = this->mP + (uVar7 + 2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    goto LAB_00526649;
  case 3:
    this->mP = this->mP + 4;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<integer>",(allocator *)local_50)
    ;
    break;
  default:
    goto switchD_00526519_caseD_4;
  case 5:
    this->mP = this->mP + 0x10;
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<guid>",(allocator *)local_50);
    break;
  case 6:
    if (3 < (long)this->mEnd - (long)this->mP) {
      uVar7 = ReadBinDWord(this);
      this->mP = this->mP + (uVar7 << 2);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"<int_list>",(allocator *)local_50);
      break;
    }
    goto switchD_00526519_caseD_4;
  case 7:
    if (3 < (long)this->mEnd - (long)this->mP) {
      uVar7 = ReadBinDWord(this);
      this->mP = this->mP + uVar7 * this->mBinaryFloatSize;
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"<flt_list>",(allocator *)local_50);
      break;
    }
switchD_00526519_caseD_4:
LAB_0052663c:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_00526649:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = s.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = s._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(s.field_2._M_allocated_capacity._1_7_,s.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = s._M_string_length;
LAB_0052666c:
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    s._M_dataplus._M_p = (pointer)paVar1;
    break;
  case 10:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"{",(allocator *)local_50);
    break;
  case 0xb:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"}",(allocator *)local_50);
    break;
  case 0xc:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(",(allocator *)local_50);
    break;
  case 0xd:
    std::__cxx11::string::string((string *)__return_storage_ptr__,")",(allocator *)local_50);
    break;
  case 0xe:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"[",(allocator *)local_50);
    break;
  case 0xf:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"]",(allocator *)local_50);
    break;
  case 0x10:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<",(allocator *)local_50);
    break;
  case 0x11:
    std::__cxx11::string::string((string *)__return_storage_ptr__,">",(allocator *)local_50);
    break;
  case 0x12:
    std::__cxx11::string::string((string *)__return_storage_ptr__,".",(allocator *)local_50);
    break;
  case 0x13:
    std::__cxx11::string::string((string *)__return_storage_ptr__,",",(allocator *)local_50);
    break;
  case 0x14:
    std::__cxx11::string::string((string *)__return_storage_ptr__,";",(allocator *)local_50);
    break;
  case 0x1f:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"template",(allocator *)local_50);
    break;
  case 0x28:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"WORD",(allocator *)local_50);
    break;
  case 0x29:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"DWORD",(allocator *)local_50);
    break;
  case 0x2a:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"FLOAT",(allocator *)local_50);
    break;
  case 0x2b:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"DOUBLE",(allocator *)local_50);
    break;
  case 0x2c:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"CHAR",(allocator *)local_50);
    break;
  case 0x2d:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UCHAR",(allocator *)local_50);
    break;
  case 0x2e:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SWORD",(allocator *)local_50);
    break;
  case 0x2f:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"SDWORD",(allocator *)local_50);
    break;
  case 0x30:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"void",(allocator *)local_50);
    break;
  case 0x31:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"string",(allocator *)local_50);
    break;
  case 0x32:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unicode",(allocator *)local_50);
    break;
  case 0x33:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"cstring",(allocator *)local_50);
    break;
  case 0x34:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"array",(allocator *)local_50);
  }
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string XFileParser::GetNextToken() {
    std::string s;

    // process binary-formatted file
    if( mIsBinaryFormat) {
        // in binary mode it will only return NAME and STRING token
        // and (correctly) skip over other tokens.
        if ( mEnd - mP < 2 ) {
            return s;
        }
        unsigned int tok = ReadBinWord();
        unsigned int len;

        // standalone tokens
        switch( tok ) {
            case 1: {
                // name token
                if ( mEnd - mP < 4 ) {
                    return s;
                }
                len = ReadBinDWord();
                const int bounds = int( mEnd - mP );
                const int iLen   = int( len );
                if ( iLen < 0 ) {
                    return s;
                }
                if ( bounds < iLen ) {
                    return s;
                }
                s = std::string( mP, len );
                mP += len;
            }
            return s;

            case 2:
                // string token
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                if( mEnd - mP < int(len)) return s;
                s = std::string(mP, len);
                mP += (len + 2);
                return s;
            case 3:
                // integer token
                mP += 4;
                return "<integer>";
            case 5:
                // GUID token
                mP += 16;
                return "<guid>";
            case 6:
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                mP += (len * 4);
                return "<int_list>";
            case 7:
                if( mEnd - mP < 4) return s;
                len = ReadBinDWord();
                mP += (len * mBinaryFloatSize);
                return "<flt_list>";
            case 0x0a:
                return "{";
            case 0x0b:
                return "}";
            case 0x0c:
                return "(";
            case 0x0d:
                return ")";
            case 0x0e:
                return "[";
            case 0x0f:
                return "]";
            case 0x10:
                return "<";
            case 0x11:
                return ">";
            case 0x12:
                return ".";
            case 0x13:
                return ",";
            case 0x14:
                return ";";
            case 0x1f:
                return "template";
            case 0x28:
                return "WORD";
            case 0x29:
                return "DWORD";
            case 0x2a:
                return "FLOAT";
            case 0x2b:
                return "DOUBLE";
            case 0x2c:
                return "CHAR";
            case 0x2d:
                return "UCHAR";
            case 0x2e:
                return "SWORD";
            case 0x2f:
                return "SDWORD";
            case 0x30:
                return "void";
            case 0x31:
                return "string";
            case 0x32:
                return "unicode";
            case 0x33:
                return "cstring";
            case 0x34:
                return "array";
        }
    }
    // process text-formatted file
    else
    {
        FindNextNoneWhiteSpace();
        if( mP >= mEnd)
            return s;

        while( (mP < mEnd) && !isspace( (unsigned char) *mP))
        {
            // either keep token delimiters when already holding a token, or return if first valid char
            if( *mP == ';' || *mP == '}' || *mP == '{' || *mP == ',')
            {
                if( !s.size())
                    s.append( mP++, 1);
                break; // stop for delimiter
            }
            s.append( mP++, 1);
        }
    }
    return s;
}